

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_pairing.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
::_add_bar(RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
           *this,Dimension dim,Pos_index birth)

{
  size_type sVar1;
  value_type_conflict1 local_20;
  uint local_1c;
  Pos_index local_18;
  Dimension local_14;
  Pos_index birth_local;
  Dimension dim_local;
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
  *this_local;
  
  local_18 = birth;
  local_14 = dim;
  _birth_local = this;
  local_1c = Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
             ::get_null_value<unsigned_int>();
  std::
  vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
  ::emplace_back<unsigned_int&,unsigned_int,int&>
            ((vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              *)&this->barcode_,&local_18,&local_1c,&local_14);
  sVar1 = std::
          vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
          ::size(&this->barcode_);
  local_20 = (int)sVar1 - 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->indexToBar_,&local_20);
  return;
}

Assistant:

void _add_bar(Dimension dim, Pos_index birth) {
    barcode_.emplace_back(birth, Master_matrix::template get_null_value<Pos_index>(), dim);
    if constexpr (Master_matrix::hasFixedBarcode || !Master_matrix::Option_list::has_removable_columns) {
      indexToBar_.push_back(barcode_.size() - 1);
    } else {
      indexToBar_.try_emplace(birth, --barcode_.end());
    }
  }